

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

type * __thiscall
fmt::v5::
visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
          (type *__return_storage_ptr__,v5 *this,
          arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
          *vis,basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
               *arg)

{
  basic_string_view<wchar_t> value;
  wchar_t *pwVar1;
  size_t sVar2;
  undefined8 uVar3;
  
  switch((int)(vis->
              super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
              ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.count_) {
  case 2:
    internal::
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
    ::operator()(__return_storage_ptr__,
                 (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                  *)this,*(int *)&(vis->
                                  super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                                  ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.out_);
    break;
  case 3:
    internal::
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
    ::operator()(__return_storage_ptr__,
                 (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                  *)this,*(uint *)&(vis->
                                   super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                                   ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.out_);
    break;
  case 4:
    internal::
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
    ::operator()(__return_storage_ptr__,
                 (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                  *)this,(longlong)
                         (vis->
                         super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                         ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.out_);
    break;
  case 5:
    internal::
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
    ::operator()(__return_storage_ptr__,
                 (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                  *)this,(unsigned_long_long)
                         (vis->
                         super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                         ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.out_);
    break;
  case 6:
    internal::
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
    ::operator()(__return_storage_ptr__,
                 (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                  *)this,*(int *)&(vis->
                                  super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                                  ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.out_ != 0
                );
    break;
  case 7:
    internal::
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
    ::operator()(__return_storage_ptr__,
                 (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                  *)this,*(wchar_t *)
                          &(vis->
                           super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                           ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.out_);
    break;
  case 8:
    internal::
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
    ::operator()(__return_storage_ptr__,
                 (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                  *)this,(double)(vis->
                                 super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                                 ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.out_);
    break;
  case 9:
    internal::
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
    ::operator()(__return_storage_ptr__,
                 (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
                  *)this,*(longdouble *)
                          &(vis->
                           super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                           ).writer_.out_.super_truncating_iterator_base<wchar_t_*>);
    break;
  case 10:
    internal::
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::operator()(__return_storage_ptr__,
                 (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                  *)this,(vis->
                         super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                         ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.out_);
    break;
  case 0xb:
    value.data_ = (vis->
                  super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                  ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.out_;
    value.size_ = (vis->
                  super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                  ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.limit_;
    internal::
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::operator()(__return_storage_ptr__,
                 (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                  *)this,value);
    break;
  case 0xc:
    internal::
    arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::operator()(__return_storage_ptr__,
                 (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                  *)this,(vis->
                         super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                         ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.out_);
    break;
  case 0xd:
    (*(code *)(vis->
              super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
              ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.limit_)
              ((vis->
               super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
               ).writer_.out_.super_truncating_iterator_base<wchar_t_*>.out_,
               *(undefined8 *)(this + 0x30));
  default:
    pwVar1 = *(wchar_t **)this;
    sVar2 = *(size_t *)(this + 8);
    uVar3 = *(undefined8 *)(this + 0x18);
    (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).count_ =
         *(size_t *)(this + 0x10);
    *(undefined8 *)&__return_storage_ptr__->blackhole_ = uVar3;
    (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar1;
    (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).limit_ = sVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}